

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logout * anon_unknown.dwarf_334836::createT11Logout
                   (Logout *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  FieldBase FStack_1c8;
  Logout logout;
  
  FIXT11::Logout::Logout(&logout);
  this = &logout.super_Message.field_0x70;
  fillHeader((Header *)this,"ISLD","TW",(int)sender);
  iVar1 = FIX::Message::bodyLength((Message *)&logout,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&FStack_1c8,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&FStack_1c8,true);
  FIX::FieldBase::~FieldBase(&FStack_1c8);
  iVar1 = FIX::Message::checkSum((Message *)&logout,10);
  FIX::CheckSum::CheckSum((CheckSum *)&FStack_1c8,iVar1);
  FIX::FieldMap::setField((FieldMap *)&logout.super_Message.field_0xe0,&FStack_1c8,true);
  FIX::FieldBase::~FieldBase(&FStack_1c8);
  FIX42::Logout::Logout(__return_storage_ptr__,(Message *)&logout);
  FIX::Message::~Message((Message *)&logout);
  return __return_storage_ptr__;
}

Assistant:

FIX42::Logout createT11Logout(const char *sender, const char *target, int seq) {
  FIXT11::Logout logout;
  fillHeader(logout.getHeader(), sender, target, seq);
  logout.getHeader().setField(BodyLength(logout.bodyLength()));
  logout.getTrailer().setField(CheckSum(logout.checkSum()));
  return logout;
}